

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qxmlstream.cpp
# Opt level: O2

void __thiscall QXmlStreamReaderPrivate::putReplacement(QXmlStreamReaderPrivate *this,QStringView s)

{
  ushort uVar1;
  uint *puVar2;
  long lVar3;
  uint uVar4;
  long lVar5;
  
  QXmlStreamSimpleStack<unsigned_int>::reserve(&this->putStack,s.m_size);
  puVar2 = (this->putStack).data;
  lVar3 = (this->putStack).tos;
  for (lVar5 = s.m_size * 2; lVar3 = lVar3 + 1, lVar5 != 0; lVar5 = lVar5 + -2) {
    uVar1 = *(ushort *)((long)s.m_data + lVar5 + -2);
    uVar4 = (uint)uVar1;
    if ((uVar1 == 0xd) || (uVar1 == 10)) {
      uVar4 = uVar1 | 0x1a0000;
    }
    (this->putStack).tos = lVar3;
    puVar2[lVar3] = uVar4;
  }
  return;
}

Assistant:

void QXmlStreamReaderPrivate::putReplacement(QStringView s)
{
    putStack.reserve(s.size());
    for (auto it = s.rbegin(), end = s.rend(); it != end; ++it) {
        char16_t c = it->unicode();
        if (c == '\n' || c == '\r')
            putStack.rawPush() = ((LETTER << 16) | c);
        else
            putStack.rawPush() = c;
    }
}